

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,TypeCast *c)

{
  pool_ref<soul::AST::Expression> *e;
  size_t *psVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  CommaSeparatedList *list;
  Constant *pCVar5;
  char cVar6;
  pool_ptr<soul::AST::Constant> cv;
  Value castValue;
  Type local_e8;
  long local_d0;
  Type local_c8;
  Value local_b0;
  Value local_70;
  
  e = &c->source;
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
  iVar3 = (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(c);
  if ((char)iVar3 == '\0') {
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
    *psVar1 = *psVar1 + 1;
  }
  else {
    pCVar5 = (Constant *)e->object;
    if (pCVar5 == (Constant *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = __dynamic_cast(pCVar5,&AST::Expression::typeinfo,&AST::CommaSeparatedList::typeinfo,0)
      ;
    }
    if ((lVar4 == 0) || (*(long *)(lVar4 + 0x38) != 0)) {
      if (pCVar5 == (Constant *)0x0) {
        list = (CommaSeparatedList *)0x0;
      }
      else {
        list = (CommaSeparatedList *)
               __dynamic_cast(pCVar5,&AST::Expression::typeinfo,&AST::CommaSeparatedList::typeinfo,0
                             );
      }
      if (list == (CommaSeparatedList *)0x0) {
        if (e->object->kind == value) {
          iVar3 = (*(e->object->super_Statement).super_ASTObject._vptr_ASTObject[3])();
          cVar6 = (char)iVar3;
        }
        else {
          cVar6 = '\0';
        }
        if (cVar6 == '\0') {
          bVar2 = false;
        }
        else {
          (*(((c->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_c8);
          bVar2 = Type::isEqual(&local_c8,&c->targetType,0);
          RefCountedPtr<soul::Structure>::decIfNotNull(local_c8.structure.object);
        }
        if (bVar2 == false) {
          (*(e->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_d0);
          if (local_d0 != 0) {
            soul::Value::tryCastToType(&local_b0,(Value *)(local_d0 + 0x30),&c->targetType);
            if (local_b0.type.category != invalid) {
              pCVar5 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value&>
                                 (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                                  &(c->super_Expression).super_Statement.super_ASTObject.context,
                                  &local_b0);
            }
            soul::Value::~Value(&local_b0);
            if (local_b0.type.category != invalid) {
              c = (TypeCast *)pCVar5;
            }
          }
        }
        else {
          c = (TypeCast *)e->object;
        }
      }
      else {
        c = (TypeCast *)
            convertExpressionListToConstant(this,&c->super_Expression,&c->targetType,list);
      }
    }
    else {
      local_e8.category = (c->targetType).category;
      local_e8.arrayElementCategory = (c->targetType).arrayElementCategory;
      local_e8.isRef = (c->targetType).isRef;
      local_e8.isConstant = (c->targetType).isConstant;
      local_e8.primitiveType.type = (c->targetType).primitiveType.type;
      local_e8.boundingSize = (c->targetType).boundingSize;
      local_e8.arrayElementBoundingSize = (c->targetType).arrayElementBoundingSize;
      local_e8.structure.object = (c->targetType).structure.object;
      if (local_e8.structure.object != (Structure *)0x0) {
        ((local_e8.structure.object)->super_RefCountedObject).refCount =
             ((local_e8.structure.object)->super_RefCountedObject).refCount + 1;
      }
      soul::Value::zeroInitialiser(&local_70,&local_e8);
      c = (TypeCast *)
          PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context_const&,soul::Value>
                    (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                     &(c->super_Expression).super_Statement.super_ASTObject.context,&local_70);
      soul::Value::~Value(&local_70);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_e8.structure.object);
    }
  }
  return &((Constant *)c)->super_Expression;
}

Assistant:

AST::Expression& visit (AST::TypeCast& c) override
        {
            super::visit (c);

            if (failIfNotResolved (c))
                return c;

            if (c.getNumArguments() == 0)
                return createConstant (c.context, Value::zeroInitialiser (c.targetType));

            if (auto list = cast<AST::CommaSeparatedList> (c.source))
                return convertExpressionListToConstant (c, c.targetType, *list);

            if (AST::isResolvedAsValue (c.source.get()) && c.source->getResultType().isIdentical (c.targetType))
                return c.source;

            if (auto cv = c.source->getAsConstant())
            {
                auto castValue = cv->value.tryCastToType (c.targetType);

                if (castValue.isValid())
                    return allocator.allocate<AST::Constant> (c.context, castValue);
            }

            return c;
        }